

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O1

void xemmai::t_fiber::f_run<xemmai::t_debug_context>(void)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  ulong *puVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  wchar_t *pwVar10;
  long in_FS_OFFSET;
  wstring_view a_message;
  undefined1 auVar11 [16];
  t_debug_context context;
  undefined8 local_58;
  ulong *local_50;
  undefined8 local_48;
  undefined8 local_30;
  
  pthread_mutex_unlock((pthread_mutex_t *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc60));
  puVar2 = *(undefined8 **)(in_FS_OFFSET + -0x30);
  puVar1 = puVar2 + -2;
  uVar3 = puVar2[-2];
  uVar4 = puVar2[-1];
  *(ulong **)(in_FS_OFFSET + -0x30) = puVar1;
  lVar5 = *(long *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc90);
  puVar6 = *(ulong **)(lVar5 + 0x10);
  pwVar10 = (wchar_t *)0x0;
  local_58 = 0;
  local_48 = 0;
  local_30 = 0;
  *(undefined8 **)(*(long *)(lVar5 + 0x10) + 0x38) = &local_58;
  *(undefined8 **)(in_FS_OFFSET + -0x30) = puVar2 + 4;
  puVar2[2] = uVar3;
  puVar2[3] = uVar4;
  *puVar2 = 0;
  uVar7 = *puVar6;
  local_50 = puVar1;
  if (4 < uVar7) {
    auVar11 = (**(code **)(*(long *)(uVar7 + 0x40) + 0xb8))(uVar7,puVar1,1);
    while( true ) {
      pwVar10 = auVar11._8_8_;
      if (auVar11._0_8_ == -1) {
        uVar3 = puVar2[-2];
        uVar4 = puVar2[-1];
        *(ulong **)(in_FS_OFFSET + -0x30) = puVar1;
        if (*(long *)(in_FS_OFFSET + -0x30) != *(long *)(puVar6[3] + 0x18)) {
          __assert_fail("f_stack() == q->v_internal->v_estack.get()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/fiber.cc"
                        ,0xa9,
                        "static void xemmai::t_fiber::f_run() [T_context = xemmai::t_debug_context]"
                       );
        }
        lVar5 = *(long *)(in_FS_OFFSET + -0x28);
        *(undefined8 *)(*(long *)(*(long *)(lVar5 + 0xc90) + 0x10) + 0x38) = local_30;
        iVar9 = pthread_mutex_lock((pthread_mutex_t *)(lVar5 + 0xc60));
        if (iVar9 == 0) {
          *(undefined8 *)(puVar6[3] + 8) = 0;
          puVar6[3] = 0;
          lVar5 = *(long *)(*(long *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc58) + 8);
          *(undefined1 *)(lVar5 + 0x70) = 0;
          puVar2 = *(undefined8 **)(lVar5 + 0x78);
          *puVar2 = uVar3;
          puVar2[1] = uVar4;
          lVar8 = *(long *)(lVar5 + 0x60);
          *(long *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc90) = lVar8;
          *(undefined8 *)(in_FS_OFFSET + -0x30) = *(undefined8 *)(lVar8 + 0x20);
          setcontext(*(long *)(lVar5 + 0x60) + 0x78);
          return;
        }
        std::__throw_system_error(iVar9);
      }
      uVar7 = *puVar1;
      if (uVar7 < 5) break;
      auVar11 = (**(code **)(*(long *)(uVar7 + 0x40) + 0xb8))(uVar7,puVar1,auVar11._0_8_);
    }
  }
  a_message._M_str = pwVar10;
  a_message._M_len = (size_t)L"not supported.";
  f_throw((xemmai *)0xe,a_message);
}

Assistant:

void t_fiber::f_run()
{
	t_thread::v_current->v_mutex.unlock();
	auto used = f_stack() - 1;
	auto x = *used;
	f_stack__(used);
	auto q = t_thread::v_current->v_active->v_fiber;
	auto b = false;
	{
		T_context context;
		try {
			x = q->v_callable(x);
		} catch (const t_rvalue& thrown) {
			q->f_caught(thrown, nullptr);
			b = true;
			x = thrown;
		} catch (...) {
			b = true;
			x = t_throwable::f_instantiate(L"<unexpected>."sv);
		}
		assert(f_stack() == q->v_internal->v_estack.get());
	}
	t_thread::v_current->v_mutex.lock();
	q->v_internal->v_thread = nullptr;
	q->v_internal = nullptr;
	auto& p = t_thread::v_current->v_thread->v_fiber->f_as<t_fiber>();
	p.v_throw = b;
	*p.v_return = x;
	t_thread::v_current->v_active = p.v_internal;
#ifdef __unix__
	f_stack__(p.v_internal->v_estack_used);
	setcontext(&p.v_internal->v_context);
#endif
#ifdef _WIN32
	v_current = p.v_internal;
	SwitchToFiber(p.v_internal->v_handle);
#endif
}